

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     swap_offsets<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                first,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      last,uchar *offsets_l,uchar *offsets_r,size_t num,bool use_swaps)

{
  undefined8 *puVar1;
  byte bVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  double dVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  double dVar12;
  pointer ppVar13;
  size_t sVar14;
  ulong uVar15;
  FractionalInteger *pFVar16;
  pointer ppVar17;
  undefined7 in_register_00000089;
  undefined4 local_6c;
  undefined4 uStack_68;
  
  if ((int)CONCAT71(in_register_00000089,use_swaps) == 0) {
    if (num != 0) {
      bVar2 = *offsets_l;
      uVar15 = (ulong)*offsets_r;
      pFVar16 = last._M_current + -uVar15;
      dVar6 = first._M_current[bVar2].fractionality;
      dVar7 = first._M_current[bVar2].row_ep_norm2;
      puVar1 = (undefined8 *)((long)&first._M_current[bVar2].row_ep_norm2 + 4);
      uVar8 = puVar1[1];
      uStack_68 = (undefined4)((ulong)*puVar1 >> 0x20);
      local_6c = (undefined4)((ulong)dVar7 >> 0x20);
      ppVar3 = first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar4 = first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ppVar5 = first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      dVar9 = last._M_current[-uVar15].row_ep_norm2;
      puVar1 = (undefined8 *)((long)&last._M_current[-uVar15].row_ep_norm2 + 4);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      first._M_current[bVar2].fractionality = last._M_current[-uVar15].fractionality;
      first._M_current[bVar2].row_ep_norm2 = dVar9;
      puVar1 = (undefined8 *)((long)&first._M_current[bVar2].row_ep_norm2 + 4);
      *puVar1 = uVar10;
      puVar1[1] = uVar11;
      ppVar17 = last._M_current[-uVar15].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           last._M_current[-uVar15].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar17;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           last._M_current[-uVar15].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      last._M_current[-uVar15].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      last._M_current[-uVar15].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      last._M_current[-uVar15].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (num == 1) {
        *(ulong *)((long)&pFVar16->row_ep_norm2 + 4) = CONCAT44(uStack_68,local_6c);
        *(undefined8 *)((long)&pFVar16->score + 4) = uVar8;
        pFVar16->fractionality = dVar6;
        pFVar16->row_ep_norm2 = dVar7;
        (pFVar16->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar3;
        (pFVar16->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar4;
        (pFVar16->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar5;
      }
      else {
        sVar14 = 1;
        do {
          bVar2 = offsets_l[sVar14];
          dVar9 = first._M_current[bVar2].fractionality;
          dVar12 = first._M_current[bVar2].row_ep_norm2;
          puVar1 = (undefined8 *)((long)&first._M_current[bVar2].row_ep_norm2 + 4);
          uVar10 = puVar1[1];
          *(undefined8 *)((long)&pFVar16->row_ep_norm2 + 4) = *puVar1;
          *(undefined8 *)((long)&pFVar16->score + 4) = uVar10;
          pFVar16->fractionality = dVar9;
          pFVar16->row_ep_norm2 = dVar12;
          ppVar17 = (pFVar16->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar13 = first._M_current[bVar2].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar16->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (pFVar16->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar13;
          (pFVar16->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          first._M_current[bVar2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          first._M_current[bVar2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          first._M_current[bVar2].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppVar17 == (pointer)0x0) {
            ppVar17 = (pointer)0x0;
          }
          else {
            operator_delete(ppVar17);
            ppVar17 = first._M_current[bVar2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          pFVar16 = first._M_current + bVar2;
          uVar15 = (ulong)offsets_r[sVar14];
          dVar9 = last._M_current[-uVar15].fractionality;
          dVar12 = last._M_current[-uVar15].row_ep_norm2;
          puVar1 = (undefined8 *)((long)&last._M_current[-uVar15].row_ep_norm2 + 4);
          uVar10 = puVar1[1];
          *(undefined8 *)((long)&pFVar16->row_ep_norm2 + 4) = *puVar1;
          *(undefined8 *)((long)&pFVar16->score + 4) = uVar10;
          pFVar16->fractionality = dVar9;
          pFVar16->row_ep_norm2 = dVar12;
          ppVar13 = last._M_current[-uVar15].row_ep.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          (pFVar16->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               last._M_current[-uVar15].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          (pFVar16->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppVar13;
          (pFVar16->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               last._M_current[-uVar15].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          last._M_current[-uVar15].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          last._M_current[-uVar15].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          last._M_current[-uVar15].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppVar17 != (pointer)0x0) {
            operator_delete(ppVar17);
          }
          pFVar16 = last._M_current + -uVar15;
          sVar14 = sVar14 + 1;
        } while (num != sVar14);
        ppVar17 = (pFVar16->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pFVar16->fractionality = dVar6;
        pFVar16->row_ep_norm2 = dVar7;
        *(ulong *)((long)&pFVar16->row_ep_norm2 + 4) = CONCAT44(uStack_68,local_6c);
        *(undefined8 *)((long)&pFVar16->score + 4) = uVar8;
        (pFVar16->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar3;
        (pFVar16->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar4;
        (pFVar16->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar5;
        if (ppVar17 != (pointer)0x0) {
          operator_delete(ppVar17);
        }
      }
    }
  }
  else if (num != 0) {
    sVar14 = 0;
    do {
      bVar2 = offsets_l[sVar14];
      uVar15 = (ulong)offsets_r[sVar14];
      dVar6 = first._M_current[bVar2].fractionality;
      dVar7 = first._M_current[bVar2].row_ep_norm2;
      puVar1 = (undefined8 *)((long)&first._M_current[bVar2].row_ep_norm2 + 4);
      uVar8 = puVar1[1];
      uStack_68 = (undefined4)((ulong)*puVar1 >> 0x20);
      local_6c = (undefined4)((ulong)dVar7 >> 0x20);
      ppVar3 = first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      ppVar4 = first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppVar5 = first._M_current[bVar2].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      dVar9 = last._M_current[-uVar15].row_ep_norm2;
      puVar1 = (undefined8 *)((long)&last._M_current[-uVar15].row_ep_norm2 + 4);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      first._M_current[bVar2].fractionality = last._M_current[-uVar15].fractionality;
      first._M_current[bVar2].row_ep_norm2 = dVar9;
      puVar1 = (undefined8 *)((long)&first._M_current[bVar2].row_ep_norm2 + 4);
      *puVar1 = uVar10;
      puVar1[1] = uVar11;
      ppVar17 = last._M_current[-uVar15].row_ep.
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           last._M_current[-uVar15].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar17;
      first._M_current[bVar2].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           last._M_current[-uVar15].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar1 = (undefined8 *)((long)&last._M_current[-uVar15].row_ep_norm2 + 4);
      *puVar1 = CONCAT44(uStack_68,local_6c);
      puVar1[1] = uVar8;
      last._M_current[-uVar15].fractionality = dVar6;
      last._M_current[-uVar15].row_ep_norm2 = dVar7;
      last._M_current[-uVar15].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = ppVar4;
      last._M_current[-uVar15].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar5;
      last._M_current[-uVar15].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppVar3;
      sVar14 = sVar14 + 1;
    } while (num != sVar14);
  }
  return;
}

Assistant:

inline void swap_offsets(Iter first, Iter last,
                             unsigned char* offsets_l, unsigned char* offsets_r,
                             size_t num, bool use_swaps) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (use_swaps) {
            // This case is needed for the descending distribution, where we need
            // to have proper swapping for pdqsort to remain O(n).
            for (size_t i = 0; i < num; ++i) {
                std::iter_swap(first + offsets_l[i], last - offsets_r[i]);
            }
        } else if (num > 0) {
            Iter l = first + offsets_l[0]; Iter r = last - offsets_r[0];
            T tmp(PDQSORT_PREFER_MOVE(*l)); *l = PDQSORT_PREFER_MOVE(*r);
            for (size_t i = 1; i < num; ++i) {
                l = first + offsets_l[i]; *r = PDQSORT_PREFER_MOVE(*l);
                r = last - offsets_r[i]; *l = PDQSORT_PREFER_MOVE(*r);
            }
            *r = PDQSORT_PREFER_MOVE(tmp);
        }
    }